

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  string *in_stack_00000028;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  allocator<char> *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  TestProperty::key((TestProperty *)0x11c858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  GetReservedAttributesForElement(in_stack_ffffffffffffffc8);
  bVar1 = ValidateTestPropertyName(in_stack_00000028,in_stack_00000020);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return bVar1;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}